

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O1

void Abc_NtkTransferNameIds(Abc_Ntk_t *p,Abc_Ntk_t *pNew)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  int *__s;
  int iVar8;
  long lVar9;
  long *plVar10;
  uint uVar11;
  
  if (p->vNameIds == (Vec_Int_t *)0x0) {
    __assert_fail("p->vNameIds != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2d8,"void Abc_NtkTransferNameIds(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNew->vNameIds == (Vec_Int_t *)0x0) {
    iVar1 = pNew->vObjs->nSize;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    iVar8 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar8 = iVar1;
    }
    pVVar7->nSize = 0;
    pVVar7->nCap = iVar8;
    if (iVar8 == 0) {
      __s = (int *)0x0;
    }
    else {
      __s = (int *)malloc((long)iVar8 << 2);
    }
    pVVar7->pArray = __s;
    pVVar7->nSize = iVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)iVar1 << 2);
    }
    pNew->vNameIds = pVVar7;
    pVVar3 = p->vObjs;
    if (0 < pVVar3->nSize) {
      ppvVar4 = pVVar3->pArray;
      lVar9 = 0;
      do {
        pvVar5 = ppvVar4[lVar9];
        if ((((pvVar5 != (void *)0x0) && (uVar6 = *(ulong *)((long)pvVar5 + 0x40), uVar6 != 0)) &&
            (lVar9 < p->vNameIds->nSize)) && (uVar2 = p->vNameIds->pArray[lVar9], uVar2 != 0)) {
          plVar10 = (long *)(uVar6 & 0xfffffffffffffffe);
          if ((Abc_Ntk_t *)*plVar10 != pNew) {
            __assert_fail("Abc_ObjNtk(pObjNew) == pNew",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                          ,0x2e2,"void Abc_NtkTransferNameIds(Abc_Ntk_t *, Abc_Ntk_t *)");
          }
          uVar11 = *(uint *)((long)plVar10 + 0x14) & 0xf;
          if (((uVar11 != 5) && (uVar11 != 2)) ||
             ((uVar11 = *(uint *)((long)pvVar5 + 0x14) & 0xf, uVar11 == 5 || (uVar11 == 2)))) {
            iVar1 = (int)plVar10[2];
            if (((long)iVar1 < 0) || (pVVar7->nSize <= iVar1)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            __s[iVar1] = uVar2 ^ (uint)uVar6 & 1;
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < pVVar3->nSize);
    }
    return;
  }
  __assert_fail("pNew->vNameIds == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                ,0x2d9,"void Abc_NtkTransferNameIds(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkTransferNameIds( Abc_Ntk_t * p, Abc_Ntk_t * pNew )
{
    Abc_Obj_t * pObj, * pObjNew;
    int i;
    assert( p->vNameIds != NULL );
    assert( pNew->vNameIds == NULL );
    pNew->vNameIds = Vec_IntStart( Abc_NtkObjNumMax(pNew) );
//    Abc_NtkForEachCi( p, pObj, i )
//        printf( "%d ", Vec_IntEntry(p->vNameIds, Abc_ObjId(pObj)) );
//    printf( "\n" );
    Abc_NtkForEachObj( p, pObj, i )
        if ( pObj->pCopy && i < Vec_IntSize(p->vNameIds) && Vec_IntEntry(p->vNameIds, i) )
        {
            pObjNew = Abc_ObjRegular(pObj->pCopy);
            assert( Abc_ObjNtk(pObjNew) == pNew );
            if ( Abc_ObjIsCi(pObjNew) && !Abc_ObjIsCi(pObj) ) // do not overwrite CI name by internal node name
                continue;
            Vec_IntWriteEntry( pNew->vNameIds, Abc_ObjId(pObjNew), Vec_IntEntry(p->vNameIds, i) ^ Abc_ObjIsComplement(pObj->pCopy) );
        }
}